

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::SharedColorbufferClearsTest::render
          (SharedColorbufferClearsTest *this,Context *context,Surface *dst)

{
  deUint32 program;
  GLenum reason;
  uint uVar1;
  uint uVar2;
  FboConfig *pFVar3;
  FboIncompleteException *this_00;
  Vector<float,_3> local_1bc;
  Vector<float,_3> local_1b0;
  deUint32 local_1a4;
  undefined1 local_1a0 [4];
  deUint32 shaderID;
  SingleTex2DShader shader;
  uint local_30;
  GLenum status;
  int fbo;
  deUint32 colorbuffer;
  int height;
  int width;
  Surface *dst_local;
  Context *context_local;
  SharedColorbufferClearsTest *this_local;
  
  pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  checkColorFormatSupport(context,pFVar3->colorbufferFormat);
  pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  if (pFVar3->colorbufferType == 0xde1) {
    (*context->_vptr_Context[6])(context,0xde1,1);
    pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
    (*context->_vptr_Context[0x7e])(context,0xde1,0,(ulong)pFVar3->colorbufferFormat,0x80,0x80);
    (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  }
  else {
    (*context->_vptr_Context[0xc])(context,0x8d41,1);
    pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
    (*context->_vptr_Context[0x23])(context,0x8d41,(ulong)pFVar3->colorbufferFormat,0x80,0x80);
  }
  for (local_30 = 1; (int)local_30 < 4; local_30 = local_30 + 1) {
    (*context->_vptr_Context[9])(context,0x8d40,(ulong)local_30);
    pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
    if (pFVar3->colorbufferType == 0xde1) {
      (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,1,0);
    }
    else {
      (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,1);
    }
  }
  (*context->_vptr_Context[9])(context,0x8d40,1);
  reason = (*context->_vptr_Context[0x21])(context,0x8d40);
  if (reason != 0x8cd5) {
    this_00 = (FboIncompleteException *)__cxa_allocate_exception(0x50);
    pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
    FboIncompleteException::FboIncompleteException
              (this_00,pFVar3,reason,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFboRenderTest.cpp"
               ,0x54f);
    __cxa_throw(this_00,&FboIncompleteException::typeinfo,
                FboIncompleteException::~FboIncompleteException);
  }
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  (*context->_vptr_Context[0x2a])(0,0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[0x33])(context,0xc11);
  (*context->_vptr_Context[9])(context,0x8d40,2);
  (*context->_vptr_Context[0x2a])(0x3f19999a,0,0,0x3f800000);
  (*context->_vptr_Context[0x32])(context,10,10,0x40);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[0x2a])(0,0x3f19999a,0,0x3f800000);
  (*context->_vptr_Context[0x32])(context,0x3c,0x3c,0x28,0x14);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[9])(context,0x8d40,3);
  (*context->_vptr_Context[0x2a])(0,0,0x3f19999a,0x3f800000);
  (*context->_vptr_Context[0x32])(context,0x14,0x14,100,10);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[9])(context,0x8d40,1);
  (*context->_vptr_Context[0x2a])(0x3f19999a,0,0x3f19999a,0x3f800000);
  (*context->_vptr_Context[0x32])(context,0x14,0x14,5,100);
  (*context->_vptr_Context[0x2d])(context,0x4000);
  (*context->_vptr_Context[0x34])(context,0xc11);
  pFVar3 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  if (pFVar3->colorbufferType == 0xde1) {
    SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_1a0);
    local_1a4 = (*context->_vptr_Context[0x75])(context,(SingleTex2DShader *)local_1a0);
    SingleTex2DShader::setUnit((SingleTex2DShader *)local_1a0,context,local_1a4,0);
    (*context->_vptr_Context[9])(context,0x8d40,0);
    uVar1 = (*context->_vptr_Context[2])();
    uVar2 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar1,(ulong)uVar2);
    program = local_1a4;
    tcu::Vector<float,_3>::Vector(&local_1b0,-0.9,-0.9,0.0);
    tcu::Vector<float,_3>::Vector(&local_1bc,0.9,0.9,0.0);
    sglr::drawQuad(context,program,&local_1b0,&local_1bc);
    uVar1 = (*context->_vptr_Context[2])();
    uVar2 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar1,(ulong)uVar2);
    SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_1a0);
  }
  else {
    (*context->_vptr_Context[0x80])(context,dst,0,0,0x80,0x80);
  }
  return;
}

Assistant:

void SharedColorbufferClearsTest::render (sglr::Context& context, Surface& dst)
{
	int			width			= 128;
	int			height			= 128;
	deUint32	colorbuffer		= 1;

	checkColorFormatSupport(context, getConfig().colorbufferFormat);

	// Single colorbuffer
	if (getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		context.bindTexture(GL_TEXTURE_2D, colorbuffer);
		context.texImage2D(GL_TEXTURE_2D, 0, getConfig().colorbufferFormat, width, height);
		context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	}
	else
	{
		DE_ASSERT(getConfig().colorbufferType == GL_RENDERBUFFER);
		context.bindRenderbuffer(GL_RENDERBUFFER, colorbuffer);
		context.renderbufferStorage(GL_RENDERBUFFER, getConfig().colorbufferFormat, width, height);
	}

	// Multiple framebuffers sharing the colorbuffer
	for (int fbo = 1; fbo <= 3; fbo++)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

		if (getConfig().colorbufferType == GL_TEXTURE_2D)
			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorbuffer, 0);
		else
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorbuffer);
	}

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// Check completeness
	{
		GLenum status = context.checkFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
			throw FboIncompleteException(getConfig(), status, __FILE__, __LINE__);
	}

	// Render to them
	context.viewport(0, 0, width, height);
	context.clearColor(0.0f, 0.0f, 1.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.enable(GL_SCISSOR_TEST);

	context.bindFramebuffer(GL_FRAMEBUFFER, 2);
	context.clearColor(0.6f, 0.0f, 0.0f, 1.0f);
	context.scissor(10, 10, 64, 64);
	context.clear(GL_COLOR_BUFFER_BIT);
	context.clearColor(0.0f, 0.6f, 0.0f, 1.0f);
	context.scissor(60, 60, 40, 20);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.bindFramebuffer(GL_FRAMEBUFFER, 3);
	context.clearColor(0.0f, 0.0f, 0.6f, 1.0f);
	context.scissor(20, 20, 100, 10);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);
	context.clearColor(0.6f, 0.0f, 0.6f, 1.0f);
	context.scissor(20, 20, 5, 100);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.disable(GL_SCISSOR_TEST);

	if (getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		SingleTex2DShader	shader;
		deUint32			shaderID = context.createProgram(&shader);

		shader.setUnit(context, shaderID, 0);

		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-0.9f, -0.9f, 0.0f), Vec3(0.9f, 0.9f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		context.readPixels(dst, 0, 0, width, height);
}